

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O1

void anon_unknown.dwarf_b4f04f::ListDependencies
               (cmDependInformation *info,FILE *fout,
               set<const_(anonymous_namespace)::cmDependInformation_*,_std::less<const_(anonymous_namespace)::cmDependInformation_*>,_std::allocator<const_(anonymous_namespace)::cmDependInformation_*>_>
               *visited)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  cmDependInformation *info_00;
  _Base_ptr p_Var3;
  pointer pcVar4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  long lVar8;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  _Rb_tree_node_base *p_Var11;
  bool bVar12;
  _Alloc_node __an;
  string tmp;
  long *local_98 [2];
  long local_88 [2];
  _Rb_tree_node_base *local_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  p_Var1 = &(visited->_M_t)._M_impl.super__Rb_tree_header;
  p_Var9 = (visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var9 == (_Base_ptr)0x0) {
    bVar12 = true;
    p_Var11 = &p_Var1->_M_header;
  }
  else {
    do {
      p_Var11 = p_Var9;
      bVar12 = info < *(cmDependInformation **)(p_Var11 + 1);
      p_Var9 = (&p_Var11->_M_left)[*(cmDependInformation **)(p_Var11 + 1) <= info];
    } while (p_Var9 != (_Base_ptr)0x0);
  }
  p_Var6 = p_Var11;
  if (bVar12) {
    if (p_Var11 == (visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left)
    goto LAB_002b2b8a;
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var11);
  }
  if (info <= *(cmDependInformation **)(p_Var6 + 1)) {
    p_Var9 = p_Var6;
    p_Var11 = (_Rb_tree_node_base *)0x0;
  }
LAB_002b2b8a:
  if (p_Var11 != (_Rb_tree_node_base *)0x0) {
    bVar12 = true;
    if ((p_Var9 == (_Base_ptr)0x0) && (p_Var1 != (_Rb_tree_header *)p_Var11)) {
      bVar12 = info < *(cmDependInformation **)(p_Var11 + 1);
    }
    p_Var6 = (_Rb_tree_node_base *)operator_new(0x28);
    *(cmDependInformation **)(p_Var6 + 1) = info;
    std::_Rb_tree_insert_and_rebalance(bVar12,p_Var6,p_Var11,&p_Var1->_M_header);
    psVar2 = &(visited->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    *psVar2 = *psVar2 + 1;
  }
  p_Var9 = (info->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_78 = &(info->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var9 != local_78) {
    do {
      info_00 = *(cmDependInformation **)(p_Var9 + 1);
      p_Var3 = (visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[*(cmDependInformation **)(p_Var3 + 1) < info_00]) {
        if (*(cmDependInformation **)(p_Var3 + 1) >= info_00) {
          p_Var7 = p_Var3;
        }
      }
      p_Var10 = p_Var1;
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         (p_Var10 = (_Rb_tree_header *)p_Var7,
         info_00 < (cmDependInformation *)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
        p_Var10 = p_Var1;
      }
      if (p_Var10 == p_Var1) {
        if ((info->FullPath)._M_string_length != 0) {
          local_98[0] = local_88;
          pcVar4 = (info_00->FullPath)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_98,pcVar4,pcVar4 + (info_00->FullPath)._M_string_length);
          lVar8 = std::__cxx11::string::rfind((char)(string *)local_98,0x2e);
          if (lVar8 == -1) {
            bVar12 = false;
          }
          else {
            std::__cxx11::string::substr((ulong)local_50,(ulong)local_98);
            iVar5 = std::__cxx11::string::compare((char *)local_50);
            bVar12 = iVar5 != 0;
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
          }
          if (bVar12) {
            std::__cxx11::string::substr((ulong)local_70,(ulong)local_98);
            std::__cxx11::string::operator=((string *)local_98,(string *)local_70);
            if (local_70[0] != local_60) {
              operator_delete(local_70[0],local_60[0] + 1);
            }
            fprintf((FILE *)fout,"%s\n",(info_00->FullPath)._M_dataplus._M_p);
          }
          if (local_98[0] != local_88) {
            operator_delete(local_98[0],local_88[0] + 1);
          }
        }
        ListDependencies(info_00,fout,visited);
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != local_78);
  }
  return;
}

Assistant:

void ListDependencies(cmDependInformation const* info, FILE* fout,
                      std::set<cmDependInformation const*>* visited)
{
  // add info to the visited set
  visited->insert(info);
  // now recurse with info's dependencies
  for (cmDependInformation* d : info->DependencySet) {
    if (visited->find(d) == visited->end()) {
      if (!info->FullPath.empty()) {
        std::string tmp = d->FullPath;
        std::string::size_type pos = tmp.rfind('.');
        if (pos != std::string::npos && (tmp.substr(pos) != ".h")) {
          tmp = tmp.substr(0, pos);
          fprintf(fout, "%s\n", d->FullPath.c_str());
        }
      }
      ListDependencies(d, fout, visited);
    }
  }
}